

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utMaterialSystem.cpp
# Opt level: O2

void __thiscall
MaterialSystemTest_testStringProperty_Test::TestBody
          (MaterialSystemTest_testStringProperty_Test *this)

{
  char *pcVar1;
  AssertHelper local_448;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_440;
  AssertionResult gtest_ar;
  aiString s;
  
  s.length = 0;
  s.data[0] = '\0';
  memset(s.data + 1,0x1b,0x3ff);
  aiString::Set(&s,"Hello, this is a small test");
  aiMaterial::AddProperty((this->super_MaterialSystemTest).pcMat,&s,"testKey6",0,0);
  aiString::Set(&s,"358358");
  local_440.ptr_._0_4_ = 0;
  local_448.data_._0_4_ =
       aiGetMaterialString((this->super_MaterialSystemTest).pcMat,"testKey6",0,0,&s);
  testing::internal::CmpHelperEQ<aiReturn,aiReturn>
            ((internal *)&gtest_ar,"aiReturn_SUCCESS","pcMat->Get(\"testKey6\",0,0,s)",
             (aiReturn *)&local_440,(aiReturn *)&local_448);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_440);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_448,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMaterialSystem.cpp"
               ,0x7f,pcVar1);
    testing::internal::AssertHelper::operator=(&local_448,(Message *)&local_440);
    testing::internal::AssertHelper::~AssertHelper(&local_448);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_440);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"\"Hello, this is a small test\"","s.data",
             "Hello, this is a small test",s.data);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_440);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_448,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMaterialSystem.cpp"
               ,0x80,pcVar1);
    testing::internal::AssertHelper::operator=(&local_448,(Message *)&local_440);
    testing::internal::AssertHelper::~AssertHelper(&local_448);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_440);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(MaterialSystemTest, testStringProperty) {
    aiString s;
    s.Set("Hello, this is a small test");
    this->pcMat->AddProperty(&s,"testKey6");
    s.Set("358358");
    EXPECT_EQ(AI_SUCCESS, pcMat->Get("testKey6",0,0,s));
    EXPECT_STREQ("Hello, this is a small test", s.data);
}